

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropLayerParams::CropLayerParams(CropLayerParams *this,CropLayerParams *from)

{
  bool bVar1;
  BorderAmounts *this_00;
  CropLayerParams *from_local;
  CropLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__CropLayerParams_006f4c70;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->offset_,&from->offset_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_cropamounts(from);
  if (bVar1) {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from->cropamounts_);
    this->cropamounts_ = this_00;
  }
  else {
    this->cropamounts_ = (BorderAmounts *)0x0;
  }
  return;
}

Assistant:

CropLayerParams::CropLayerParams(const CropLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      offset_(from.offset_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_cropamounts()) {
    cropamounts_ = new ::CoreML::Specification::BorderAmounts(*from.cropamounts_);
  } else {
    cropamounts_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CropLayerParams)
}